

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SendMessage.cpp
# Opt level: O1

string * __thiscall
SendMessage::execute_abi_cxx11_(string *__return_storage_ptr__,SendMessage *this)

{
  pointer pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *__s;
  bool bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long *plVar8;
  undefined8 *puVar9;
  DIR *__dirp;
  size_t sVar10;
  long *plVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong __val;
  uint __len;
  string path_to_file;
  string __str;
  string path_of_Directory;
  string receiver_print;
  fstream mail;
  allocator local_349;
  long *local_348;
  ulong local_340;
  long local_338;
  long lStack_330;
  string *local_328;
  ulong *local_320;
  long local_318;
  ulong local_310;
  long lStack_308;
  ulong *local_300;
  long local_2f8;
  ulong local_2f0 [2];
  long *local_2e0;
  long local_2d8;
  long local_2d0;
  long lStack_2c8;
  long *local_2c0;
  long local_2b8;
  long local_2b0;
  long lStack_2a8;
  long *local_2a0;
  ulong local_298;
  long local_290;
  long lStack_288;
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  undefined1 *local_260;
  ulong local_258;
  undefined1 local_250 [16];
  long *local_240;
  long local_238;
  long local_230;
  long lStack_228;
  
  local_328 = __return_storage_ptr__;
  lVar7 = std::chrono::_V2::system_clock::now();
  local_280[0] = local_270;
  pcVar1 = (this->receiver)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_280,pcVar1,pcVar1 + (this->receiver)._M_string_length);
  std::__cxx11::string::pop_back();
  std::__cxx11::string::string
            ((string *)&local_348,(this->super_ServerOperation).MESSAGEDIR,(allocator *)&local_320);
  plVar8 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_348,local_340,0,'\x01');
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_230 = *plVar11;
    lStack_228 = plVar8[3];
    local_240 = &local_230;
  }
  else {
    local_230 = *plVar11;
    local_240 = (long *)*plVar8;
  }
  local_238 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_240,(ulong)(this->receiver)._M_dataplus._M_p);
  local_2e0 = &local_2d0;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_2d0 = *plVar11;
    lStack_2c8 = plVar8[3];
  }
  else {
    local_2d0 = *plVar11;
    local_2e0 = (long *)*plVar8;
  }
  local_2d8 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_240 != &local_230) {
    operator_delete(local_240);
  }
  if (local_348 != &local_338) {
    operator_delete(local_348);
  }
  std::__cxx11::string::string
            ((string *)&local_260,(this->super_ServerOperation).MESSAGEDIR,&local_349);
  plVar8 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_260,local_258,0,'\x01');
  local_2c0 = &local_2b0;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_2b0 = *plVar11;
    lStack_2a8 = plVar8[3];
  }
  else {
    local_2b0 = *plVar11;
    local_2c0 = (long *)*plVar8;
  }
  local_2b8 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2c0,(ulong)(this->receiver)._M_dataplus._M_p);
  local_2a0 = &local_290;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_290 = *plVar11;
    lStack_288 = plVar8[3];
  }
  else {
    local_290 = *plVar11;
    local_2a0 = (long *)*plVar8;
  }
  local_298 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_2a0,local_298,0,'\x01');
  uVar13 = lVar7 / 1000000;
  puVar12 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar12) {
    local_310 = *puVar12;
    lStack_308 = plVar8[3];
    local_320 = &local_310;
  }
  else {
    local_310 = *puVar12;
    local_320 = (ulong *)*plVar8;
  }
  local_318 = plVar8[1];
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  __val = -uVar13;
  if (0 < (long)uVar13) {
    __val = uVar13;
  }
  __len = 1;
  if (9 < __val) {
    uVar13 = __val;
    uVar6 = 4;
    do {
      __len = uVar6;
      if (uVar13 < 100) {
        __len = __len - 2;
        goto LAB_00105d27;
      }
      if (uVar13 < 1000) {
        __len = __len - 1;
        goto LAB_00105d27;
      }
      if (uVar13 < 10000) goto LAB_00105d27;
      bVar4 = 99999 < uVar13;
      uVar13 = uVar13 / 10000;
      uVar6 = __len + 4;
    } while (bVar4);
    __len = __len + 1;
  }
LAB_00105d27:
  local_300 = local_2f0;
  std::__cxx11::string::_M_construct((ulong)&local_300,(lVar7 < -999999) + (char)__len);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)((ulong)(lVar7 < -999999) + (long)local_300),__len,__val);
  uVar13 = 0xf;
  if (local_320 != &local_310) {
    uVar13 = local_310;
  }
  if (uVar13 < (ulong)(local_2f8 + local_318)) {
    uVar13 = 0xf;
    if (local_300 != local_2f0) {
      uVar13 = local_2f0[0];
    }
    if ((ulong)(local_2f8 + local_318) <= uVar13) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,(ulong)local_320);
      goto LAB_00105dc8;
    }
  }
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_300);
LAB_00105dc8:
  local_240 = &local_230;
  plVar8 = puVar9 + 2;
  if ((long *)*puVar9 == plVar8) {
    local_230 = *plVar8;
    lStack_228 = puVar9[3];
  }
  else {
    local_230 = *plVar8;
    local_240 = (long *)*puVar9;
  }
  local_238 = puVar9[1];
  *puVar9 = plVar8;
  puVar9[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_240);
  local_348 = &local_338;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_338 = *plVar11;
    lStack_330 = plVar8[3];
  }
  else {
    local_338 = *plVar11;
    local_348 = (long *)*plVar8;
  }
  local_340 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_240 != &local_230) {
    operator_delete(local_240);
  }
  if (local_300 != local_2f0) {
    operator_delete(local_300);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0);
  }
  if (local_260 != local_250) {
    operator_delete(local_260);
  }
  plVar11 = local_2e0;
  plVar8 = local_348;
  pcVar2 = (this->sender)._M_dataplus._M_p;
  pcVar3 = (this->subject)._M_dataplus._M_p;
  __s = (this->message_final)._M_dataplus._M_p;
  __dirp = opendir((char *)local_2e0);
  if (__dirp == (DIR *)0x0) {
    mkdir((char *)plVar11,0x1ff);
  }
  else {
    closedir(__dirp);
  }
  std::fstream::fstream(&local_240);
  std::fstream::open((char *)&local_240,(_Ios_Openmode)plVar8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Sender: ",8);
  iVar5 = (int)(ostream *)&local_230;
  if (pcVar2 == (char *)0x0) {
    std::ios::clear(iVar5 + (int)*(undefined8 *)(local_230 + -0x18));
  }
  else {
    sVar10 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar2,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"Subject: ",9);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear(iVar5 + (int)*(undefined8 *)(local_230 + -0x18));
  }
  else {
    sVar10 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar3,sVar10);
  }
  if (__s == (char *)0x0) {
    std::ios::clear(iVar5 + (int)*(undefined8 *)(local_230 + -0x18));
  }
  else {
    sVar10 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,__s,sVar10);
  }
  std::fstream::close();
  pcVar2 = (this->super_ServerOperation).SUCCESS;
  pcVar3 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
  strlen(pcVar2);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_ServerOperation).statusMessage,0,pcVar3,(ulong)pcVar2);
  (local_328->_M_dataplus)._M_p = (pointer)&local_328->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"Message sent!\n","");
  std::fstream::~fstream(&local_240);
  if (local_348 != &local_338) {
    operator_delete(local_348);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0);
  }
  if (local_280[0] != local_270) {
    operator_delete(local_280[0]);
  }
  return local_328;
}

Assistant:

string SendMessage::execute() {
    std::chrono::milliseconds ms = std::chrono::duration_cast< std::chrono::milliseconds >(
            std::chrono::system_clock::now().time_since_epoch()
    );
    /// save receiver with \n on the end of the string
    string receiver_print = receiver;
    ///delete \n from the end of the string for routing in directories
    receiver.pop_back();
    ///build correct path into directory of the receiver
    string path_of_Directory = string(MESSAGEDIR) + '/' + receiver;
    ///build a unique path to the mail txt file
    string path_to_file = string(MESSAGEDIR) + '/' + receiver + '/' + std::to_string(ms.count()) + ".txt";

    ///convert all strings into char * for functions opendir, mkdir, fprintf
    const char * path = path_of_Directory.c_str();
    const char * path_to_File = path_to_file.c_str();
    const char * sender_char = sender.c_str();
    const char * subject_char = subject.c_str();
    const char * message_final_char = message_final.c_str();

    ///check if the directory is available, if not - create new
    DIR* test = opendir(path);
    if(test == nullptr){
        mkdir(path, 0777);
    }
    else{
        closedir(test);
    }

    ///open the file with the unique path
    fstream mail;
    mail.open(path_to_File, fstream::out);

    ///write all information into the mail-txt file.
    mail << "Sender: " << sender_char;
    mail << "Subject: " << subject_char;
    mail << message_final_char;

    ///close the file
    mail.close();

    statusMessage = SUCCESS;
    return "Message sent!\n";
}